

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int anon_unknown.dwarf_20105c::codepoint_width(uint32_t ucs)

{
  bool bVar1;
  undefined4 local_c;
  uint32_t ucs_local;
  
  bVar1 = IsControl(ucs);
  if (bVar1) {
    local_c = -1;
  }
  else {
    bVar1 = IsCombining(ucs);
    if (bVar1) {
      local_c = 0;
    }
    else {
      bVar1 = IsFullWidth(ucs);
      if (bVar1) {
        local_c = 2;
      }
      else {
        local_c = 1;
      }
    }
  }
  return local_c;
}

Assistant:

int codepoint_width(uint32_t ucs) {
  if (IsControl(ucs))
    return -1;

  if (IsCombining(ucs))
    return 0;

  if (IsFullWidth(ucs))
    return 2;

  return 1;
}